

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcphuff.c
# Opt level: O1

void encode_mcu_AC_first_prepare
               (JCOEF *block,int *jpeg_natural_order_start,int Sl,int Al,JCOEF *values,size_t *bits)

{
  short sVar1;
  byte bVar2;
  ushort uVar3;
  ulong uVar4;
  int Sl0;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  
  if (Sl < 1) {
    uVar4 = 0;
  }
  else {
    uVar6 = 0;
    uVar4 = 0;
    do {
      sVar1 = block[jpeg_natural_order_start[uVar6]];
      uVar7 = (uint)sVar1;
      if (sVar1 != 0) {
        uVar5 = -uVar7;
        if (0 < (int)uVar7) {
          uVar5 = uVar7;
        }
        bVar2 = (byte)Al & 0x1f;
        if (uVar5 >> bVar2 != 0) {
          uVar3 = (ushort)(uVar5 >> bVar2);
          values[uVar6] = uVar3;
          values[uVar6 + 0x40] = sVar1 >> 0xf ^ uVar3;
          uVar4 = uVar4 | 1L << (uVar6 & 0x3f);
        }
      }
      uVar6 = uVar6 + 1;
    } while ((uint)Sl != uVar6);
  }
  *bits = uVar4;
  return;
}

Assistant:

METHODDEF(void)
encode_mcu_AC_first_prepare(const JCOEF *block,
                            const int *jpeg_natural_order_start, int Sl,
                            int Al, JCOEF *values, size_t *bits)
{
  register int k, temp, temp2;
  size_t zerobits = 0U;
  int Sl0 = Sl;

#if SIZEOF_SIZE_T == 4
  if (Sl0 > 32)
    Sl0 = 32;
#endif

  COMPUTE_ABSVALUES_AC_FIRST(Sl0);

  bits[0] = zerobits;
#if SIZEOF_SIZE_T == 4
  zerobits = 0U;

  if (Sl > 32) {
    Sl -= 32;
    jpeg_natural_order_start += 32;
    values += 32;

    COMPUTE_ABSVALUES_AC_FIRST(Sl);
  }
  bits[1] = zerobits;
#endif
}